

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleRoot.cpp
# Opt level: O3

PropertyQueryFlags __thiscall
Js::ModuleRoot::HasPropertyQuery(ModuleRoot *this,PropertyId propertyId,PropertyValueInfo *info)

{
  RecyclableObject *instance;
  PropertyQueryFlags PVar1;
  BOOL BVar2;
  
  PVar1 = DynamicObject::HasPropertyQuery((DynamicObject *)this,propertyId,info);
  if (PVar1 == Property_Found) {
    return Property_Found;
  }
  instance = (RecyclableObject *)(this->super_RootObjectBase).hostObject.ptr;
  if ((instance != (RecyclableObject *)0x0) &&
     (BVar2 = JavascriptOperators::HasProperty(instance,propertyId), BVar2 != 0)) {
    return Property_Found;
  }
  PVar1 = GlobalObject::HasPropertyQuery
                    ((((((this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
                         type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                     globalObject.ptr,propertyId,info);
  return PVar1;
}

Assistant:

PropertyQueryFlags ModuleRoot::HasPropertyQuery(PropertyId propertyId, _Inout_opt_ PropertyValueInfo* info)
    {
        if (JavascriptConversion::PropertyQueryFlagsToBoolean(DynamicObject::HasPropertyQuery(propertyId, info)))
        {
            return PropertyQueryFlags::Property_Found;
        }
        else if (this->hostObject && JavascriptOperators::HasProperty(this->hostObject, propertyId))
        {
            return PropertyQueryFlags::Property_Found;
        }
        return this->GetLibrary()->GetGlobalObject()->GlobalObject::HasPropertyQuery(propertyId, info);
    }